

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockSettingsRenameNodeReferences(ImGuiID old_node_id,ImGuiID new_node_id)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow_conflict *pIVar1;
  char *pcVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImGuiWindow_conflict **ppIVar4;
  ImGuiWindowSettings *p;
  int window_n;
  int i;
  
  pIVar3 = GImGui;
  this = &GImGui->Windows;
  for (i = 0; i < this->Size; i = i + 1) {
    ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,i);
    pIVar1 = *ppIVar4;
    if ((pIVar1->DockId == old_node_id) && (pIVar1->DockNode == (ImGuiDockNode *)0x0)) {
      pIVar1->DockId = new_node_id;
    }
  }
  pcVar2 = (pIVar3->SettingsWindows).Buf.Data;
  p = (ImGuiWindowSettings *)(pcVar2 + 4);
  if (pcVar2 == (char *)0x0) {
    p = (ImGuiWindowSettings *)0x0;
  }
  for (; p != (ImGuiWindowSettings *)0x0;
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar3->SettingsWindows,p)) {
    if (p->DockId == old_node_id) {
      p->DockId = new_node_id;
    }
  }
  return;
}

Assistant:

static void ImGui::DockSettingsRenameNodeReferences(ImGuiID old_node_id, ImGuiID new_node_id)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_DOCKING("DockSettingsRenameNodeReferences: from 0x%08X -> to 0x%08X\n", old_node_id, new_node_id);
    for (int window_n = 0; window_n < g.Windows.Size; window_n++)
    {
        ImGuiWindow* window = g.Windows[window_n];
        if (window->DockId == old_node_id && window->DockNode == NULL)
            window->DockId = new_node_id;
    }
    //// FIXME-OPT: We could remove this loop by storing the index in the map
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->DockId == old_node_id)
            settings->DockId = new_node_id;
}